

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O3

void __thiscall Inject::bind_to_self::test_method(bind_to_self *this)

{
  int iVar1;
  ptr_type *ppVar2;
  undefined4 extraout_var;
  component<Inject::impl1> b1;
  undefined1 local_178 [8];
  injected<Inject::impl1> p;
  undefined **local_160;
  undefined1 local_158;
  _Base_ptr local_150;
  _Base_ptr local_148;
  size_t local_140;
  provides<Inject::impl1> b2;
  size_t *local_130;
  _Base_ptr local_128;
  undefined1 local_120 [8];
  _Base_ptr local_118;
  shared_count sStack_110;
  context<0> *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  context<0> c;
  undefined **local_68;
  undefined1 local_60;
  undefined8 *local_58;
  size_t **local_50;
  undefined **local_48;
  undefined1 local_40;
  undefined8 *local_38;
  _Base_ptr *local_30;
  
  inject::context<0>::component<Inject::impl1>::component(&b1);
  inject::context<0>::component<Inject::impl1>::provides<Inject::impl1>::provides(&b2);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_00163e68;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::bind<Inject::impl1,Inject::impl1,(inject::component_scope)0>
            (inject::context<0>::head()::_head);
  inject::context<0>::get_current();
  inject::context<0>::instance<Inject::impl1>((context<0> *)&p);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_f0 = "";
  local_108 = (context<0> *)&boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0x18a);
  local_158 = 0;
  local_160 = &PTR__lazy_ostream_00163f68;
  local_150 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_148 = (_Base_ptr)0x152778;
  ppVar2 = inject::context<0>::injected<Inject::impl1>::ptr(&p);
  iVar1 = (**(ppVar2->px->super_service)._vptr_service)();
  local_178 = (undefined1  [8])CONCAT44(extraout_var,iVar1);
  local_140 = inject::id_of<Inject::impl1>::id();
  local_120[0] = CONCAT44(extraout_var,iVar1) == local_140;
  local_130 = &local_140;
  local_118 = (_Base_ptr)0x0;
  sStack_110.pi_ = (sp_counted_base *)0x0;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_e0 = "";
  local_128 = (_Base_ptr)local_178;
  local_30 = &local_128;
  local_40 = 0;
  local_48 = &PTR__lazy_ostream_00163fb8;
  local_38 = &boost::unit_test::lazy_ostream::inst;
  local_50 = &local_130;
  local_60 = 0;
  local_68 = &PTR__lazy_ostream_00163fb8;
  local_58 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (local_120,&local_160,&local_e8,0x18a,1,2,2,"p->id()",&local_48,"id_of<impl1>::id()",
             &local_68);
  boost::detail::shared_count::~shared_count(&sStack_110);
  boost::detail::shared_count::~shared_count(&p._ptr.pn);
  c._vptr_context = (_func_int **)&PTR__context_00163e68;
  inject::context<0>::head()::_head = c._parent;
  inject::context<0>::current()::_current = c._parent;
  std::
  _Rb_tree<long,_std::pair<const_long,_boost::shared_ptr<void>_>,_std::_Select1st<std::pair<const_long,_boost::shared_ptr<void>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_boost::shared_ptr<void>_>_>_>
  ::~_Rb_tree(&c._singletons._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_inject::binding>,_std::_Select1st<std::pair<const_long,_inject::binding>_>,_std::less<long>,_std::allocator<std::pair<const_long,_inject::binding>_>_>
  ::~_Rb_tree(&c._bindings._M_t);
  inject::context<0>::component<Inject::impl1>::~component(&b1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bind_to_self)
{
    context<>::component<impl1> b1;
    context<>::component<impl1>::provides<impl1> b2;

    context<> c;
    
    c.bind<impl1>();
    context<>::injected<impl1> p;
    BOOST_CHECK_EQUAL(p->id(), id_of<impl1>::id());
}